

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

ModulePtr chaiscript::bootstrap::standard_library::detail::
          input_range_type_impl<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>>
                    (string *type,ModulePtr *m)

{
  Type_Info ti;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ModulePtr MVar1;
  Module *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  ModulePtr *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  allocator local_239;
  string local_238 [32];
  code *local_218;
  undefined8 local_210;
  allocator local_1f1;
  string local_1f0 [32];
  code *local_1d0;
  undefined8 local_1c8;
  allocator local_1a9;
  string local_1a8 [32];
  code *local_188;
  undefined8 local_180;
  allocator local_161;
  string local_160 [32];
  code *local_140;
  undefined8 local_138;
  allocator local_119;
  string local_118 [32];
  code *local_f8;
  undefined8 local_f0;
  allocator local_d1;
  string local_d0 [64];
  string local_90 [64];
  string local_50 [32];
  string *local_30;
  Module *pMStack_28;
  Proxy_Function *local_20;
  
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f9bca);
  user_type<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>>();
  std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  ti.m_bare_type_info = (type_info *)in_stack_fffffffffffffd28;
  ti.m_type_info = (type_info *)in_stack_fffffffffffffd20;
  ti._16_8_ = in_stack_fffffffffffffd30;
  Module::add(pMStack_28,ti,local_30);
  std::__cxx11::string::~string(local_50);
  std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  copy_constructor<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>>
            (in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f9cae);
  std::shared_ptr<chaiscript::Module>::~shared_ptr((shared_ptr<chaiscript::Module> *)0x3f9cbb);
  std::__cxx11::string::~string(local_90);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f9cd5);
  constructor<chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>(std::__cxx11::string&)>
            ();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"range_internal",&local_d1);
  Module::add(in_stack_fffffffffffffd20,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3f9d57);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f9d64);
  local_f8 = Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::empty;
  local_f0 = 0;
  fun<bool,chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>>
            ((offset_in_Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_to_subr
              )in_stack_fffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"empty",&local_119);
  Module::add(in_stack_fffffffffffffd20,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3f9e11);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f9e1e);
  local_140 = Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pop_front;
  local_138 = 0;
  fun<void,chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>>
            ((offset_in_Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_to_subr
              )in_stack_fffffffffffffd30);
  paVar2 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"pop_front",paVar2);
  Module::add(in_stack_fffffffffffffd20,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3f9ecb);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f9ed8);
  local_188 = Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::front;
  local_180 = 0;
  fun<char&,chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>>
            ((offset_in_Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_to_subr
              )in_stack_fffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"front",&local_1a9);
  Module::add(in_stack_fffffffffffffd20,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3f9f85);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3f9f92);
  local_1d0 = Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pop_back;
  local_1c8 = 0;
  fun<void,chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>>
            ((offset_in_Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_to_subr
              )in_stack_fffffffffffffd30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"pop_back",&local_1f1);
  Module::add(in_stack_fffffffffffffd20,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3fa03f);
  std::__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3fa04c);
  local_218 = Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::back;
  local_210 = 0;
  fun<char&,chaiscript::bootstrap::standard_library::Bidir_Range<std::__cxx11::string>>
            ((offset_in_Bidir_Range<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_to_subr
              )in_stack_fffffffffffffd30);
  paVar2 = &local_239;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"back",paVar2);
  Module::add(in_stack_fffffffffffffd20,local_20,(string *)pMStack_28);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x3fa0f9);
  std::shared_ptr<chaiscript::Module>::shared_ptr
            ((shared_ptr<chaiscript::Module> *)pMStack_28,(shared_ptr<chaiscript::Module> *)local_30
            );
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ModulePtr)MVar1.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr input_range_type_impl(const std::string &type, ModulePtr m = std::make_shared<Module>())
          {
            m->add(user_type<Bidir_Type>(), type + "_Range");

            copy_constructor<Bidir_Type>(type + "_Range", m);

            m->add(constructor<Bidir_Type (typename Bidir_Type::container_type &)>(), "range_internal");

            m->add(fun(&Bidir_Type::empty), "empty");
            m->add(fun(&Bidir_Type::pop_front), "pop_front");
            m->add(fun(&Bidir_Type::front), "front");
            m->add(fun(&Bidir_Type::pop_back), "pop_back");
            m->add(fun(&Bidir_Type::back), "back");

            return m;
          }